

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O2

void __thiscall HEkkDualRHS::chooseNormal(HEkkDualRHS *this,HighsInt *chIndex)

{
  double dVar1;
  double dVar2;
  int iVar3;
  HEkk *pHVar4;
  int iVar5;
  bool bVar6;
  HighsInt HVar7;
  HighsInt HVar8;
  int in_register_00000004;
  ulong uVar9;
  ulong uVar10;
  HighsInt section;
  int iVar11;
  long lVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  int local_34;
  
  if (this->workCount == 0) {
    *chIndex = -1;
    return;
  }
  local_34 = in_register_00000004;
  bVar6 = HighsSimplexAnalysis::simplexTimerRunning(this->analysis,0x26,0);
  if (!bVar6) {
    HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x26,0);
  }
  pHVar4 = this->ekk_instance_;
  HVar7 = this->workCount;
  if (HVar7 < 0) {
    HVar8 = HighsRandom::integer(&pHVar4->random_,-HVar7);
    dVar14 = 0.0;
    uVar9 = 0xffffffffffffffff;
    for (iVar11 = 0; iVar11 != 2; iVar11 = iVar11 + 1) {
      iVar5 = HVar8;
      iVar3 = 0;
      if (iVar11 == 0) {
        iVar5 = -HVar7;
        iVar3 = HVar8;
      }
      for (uVar10 = (ulong)iVar3; (long)uVar10 < (long)iVar5; uVar10 = uVar10 + 1) {
        dVar1 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar10];
        if (1e-50 < dVar1) {
          dVar2 = (pHVar4->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar10];
          dVar15 = dVar14 * dVar2;
          if (dVar15 < dVar1) {
            uVar9 = uVar10;
          }
          uVar9 = uVar9 & 0xffffffff;
          uVar13 = -(ulong)(dVar15 < dVar1);
          dVar14 = (double)(~uVar13 & (ulong)dVar14 | (ulong)(dVar1 / dVar2) & uVar13);
        }
      }
    }
    *chIndex = (HighsInt)uVar9;
    goto LAB_0033f7ed;
  }
  HVar7 = HighsRandom::integer(&pHVar4->random_,HVar7);
  dVar14 = 0.0;
  local_34 = -1;
  for (iVar11 = 0; iVar11 != 2; iVar11 = iVar11 + 1) {
    iVar5 = HVar7;
    iVar3 = 0;
    if (iVar11 == 0) {
      iVar5 = this->workCount;
      iVar3 = HVar7;
    }
    for (lVar12 = (long)iVar3; lVar12 < iVar5; lVar12 = lVar12 + 1) {
      iVar3 = (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12];
      dVar1 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start[iVar3];
      if ((1e-50 < dVar1) &&
         (dVar2 = (this->ekk_instance_->dual_edge_weight_).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar3], dVar14 * dVar2 < dVar1)) {
        dVar14 = dVar1 / dVar2;
        local_34 = iVar3;
      }
    }
  }
  if (local_34 == -1) {
    if (0.0 < this->workCutoff) goto LAB_0033f7cb;
    iVar11 = -1;
  }
  else {
    iVar11 = local_34;
    if (dVar14 <= this->workCutoff * 0.99) {
LAB_0033f7cb:
      createInfeasList(this,0.0);
      chooseNormal(this,&local_34);
      iVar11 = local_34;
    }
  }
  *chIndex = iVar11;
LAB_0033f7ed:
  if (bVar6) {
    return;
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x26,0);
  return;
}

Assistant:

void HEkkDualRHS::chooseNormal(HighsInt* chIndex) {
  // Moved the following to the top to avoid starting the clock for a trivial
  // call. NB Must still call HighsInt to maintain sequence of random numbers
  // for code reproducibility!! Never mind if we're not timing the random number
  // call!!
  // HighsInt random = ekk_instance_.random_.integer();
  if (workCount == 0) {
    *chIndex = -1;
    return;
  }

  // Since chooseNormal calls itself, only start the clock if it's not
  // currently running
  bool keep_timer_running = analysis->simplexTimerRunning(ChuzrDualClock);
  //      timer.clock_start[info.clock_[ChuzrDualClock]] < 0;
  if (!keep_timer_running) {
    analysis->simplexTimerStart(ChuzrDualClock);
  }

  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  if (workCount < 0) {
    // DENSE mode
    const HighsInt numRow = -workCount;
    HighsInt randomStart = ekk_instance_.random_.integer(numRow);
    double bestMerit = 0;
    HighsInt bestIndex = -1;
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? numRow : randomStart;
      for (HighsInt iRow = start; iRow < end; iRow++) {
        if (work_infeasibility[iRow] > kHighsZero) {
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          //	  printf("Dense: Row %4" HIGHSINT_FORMAT " weight = %g\n", iRow,
          // myWeight);
          if (bestMerit * myWeight < myInfeas) {
            bestMerit = myInfeas / myWeight;
            bestIndex = iRow;
          }
        }
      }
    }
    *chIndex = bestIndex;
  } else {
    // SPARSE mode
    HighsInt randomStart = ekk_instance_.random_.integer(workCount);
    double bestMerit = 0;
    HighsInt bestIndex = -1;
    std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? workCount : randomStart;
      for (HighsInt i = start; i < end; i++) {
        HighsInt iRow = workIndex[i];
        if (work_infeasibility[iRow] > kHighsZero) {
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          /*
          const double myMerit = myInfeas / myWeight;
          printf("CHUZR: iRow = %6" HIGHSINT_FORMAT "; Infeas = %11.4g; Weight =
          %11.4g; Merit = %11.4g\n", iRow, myInfeas, myWeight, myMerit);
          */
          if (bestMerit * myWeight < myInfeas) {
            bestMerit = myInfeas / myWeight;
            bestIndex = iRow;
          }
        }
      }
    }

    HighsInt createListAgain = 0;
    if (bestIndex == -1) {
      createListAgain = workCutoff > 0;
    } else if (bestMerit <= workCutoff * 0.99) {
      createListAgain = 1;
    }
    if (createListAgain) {
      createInfeasList(0);
      chooseNormal(&bestIndex);
    }
    *chIndex = bestIndex;
  }
  // Since chooseNormal calls itself, only stop the clock if it's not currently
  // running
  if (!keep_timer_running) analysis->simplexTimerStop(ChuzrDualClock);
}